

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

bool TestAllRecoveryData(WirehairCodec encoder,WirehairCodec decoder,uint N,uint blockBytes,
                        uint finalBytes,uint8_t *message,uint8_t *decodedMessage,uint messageBytes)

{
  WirehairCodec codec;
  bool bVar1;
  WirehairResult WVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  uint blockId;
  uint32_t writeLen;
  WirehairCodec local_50;
  uint local_48;
  uint32_t Nm1Len;
  WirehairCodec local_40;
  uint8_t *local_38;
  
  Nm1Len = 0;
  local_38 = message;
  WVar2 = wirehair_encode(encoder,N - 1,decodedMessage,blockBytes,&Nm1Len);
  if (WVar2 == Wirehair_Success) {
    local_50 = decoder;
    local_40 = encoder;
    if (Nm1Len == finalBytes) {
      local_48 = finalBytes;
      WVar2 = wirehair_decode(decoder,N - 1,decodedMessage,finalBytes);
      codec = local_40;
      if (WVar2 == Wirehair_NeedMore) {
        uVar3 = 2;
        blockId = N;
        while( true ) {
          writeLen = 0;
          WVar2 = wirehair_encode(codec,blockId,decodedMessage,blockBytes,&writeLen);
          if (WVar2 != Wirehair_Success) break;
          if (writeLen != blockBytes) {
            poVar5 = (ostream *)&std::cout;
            pcVar4 = "wirehair_encode failed wrong len for N-1 and N = ";
            goto LAB_00102a65;
          }
          WVar2 = wirehair_decode(local_50,blockId,decodedMessage,blockBytes);
          if (WVar2 != Wirehair_NeedMore) {
            if (WVar2 != Wirehair_Success) {
              poVar5 = std::operator<<((ostream *)&std::cout,"wirehair_decode failed for ");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              pcVar4 = " and N = ";
              goto LAB_00102a65;
            }
            if (N + 4 <= uVar3) {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "TestAllRecoveryData: Too much overhead: ");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              poVar5 = std::operator<<(poVar5," extra for N=");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              poVar5 = std::operator<<(poVar5," Seed=n/a BlockBytes=");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            bVar1 = DoesCodecProduceOriginals
                              (local_50,N,blockBytes,local_48,local_38,decodedMessage,messageBytes);
            if (bVar1) {
              return true;
            }
            poVar5 = std::operator<<((ostream *)&std::cout,"!! Decoder2 failed to produce originals"
                                    );
            goto LAB_00102a74;
          }
          blockId = blockId + 1;
          uVar3 = uVar3 + 1;
        }
        poVar5 = (ostream *)&std::cout;
        pcVar4 = "wirehair_encode failed for N = ";
        goto LAB_00102a65;
      }
      pcVar4 = "wirehair_decode failed for N-1 and N = ";
    }
    else {
      pcVar4 = "wirehair_encode failed wrong len for N-1 and N = ";
    }
  }
  else {
    pcVar4 = "wirehair_encode failed for N-1 and N = ";
  }
  poVar5 = (ostream *)&std::cout;
LAB_00102a65:
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
LAB_00102a74:
  std::endl<char,std::char_traits<char>>(poVar5);
  return false;
}

Assistant:

static bool TestAllRecoveryData(
    WirehairCodec encoder,
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    unsigned needed = 0;

#ifdef ENABLE_ALL_RECOVERY_FINAL_BLOCK
    // Check the special case final block:
    {
        uint32_t Nm1Len = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, N - 1, decodedMessage, blockBytes, &Nm1Len);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N-1 and N = " << N << endl;
            return false;
        }

        if (Nm1Len != finalBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, N - 1, decodedMessage, Nm1Len);

        if (decodeResult != Wirehair_NeedMore)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for N-1 and N = " << N << endl;
            return false;
        }

        ++needed;
    }
#endif

    for (unsigned blockId = N;; ++blockId)
    {
        ++needed;

        uint32_t writeLen = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, blockId, decodedMessage, blockBytes, &writeLen);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N = " << N << endl;
            return false;
        }

        if (writeLen != blockBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, blockId, decodedMessage, writeLen);

        if (decodeResult != Wirehair_NeedMore)
        {
            if (decodeResult == Wirehair_Success) {
                break;
            }

            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for " << blockId << " and N = " << N << endl;
            return false;
        }
    }

    if (needed >= N + kExtraWarnThreshold) {
        //SIAMESE_DEBUG_BREAK();
        cout << "TestAllRecoveryData: Too much overhead: " << (needed - N) << " extra for N=" << N << " Seed=n/a BlockBytes=" << blockBytes << endl;
        //return false;
    }

    if (!DoesCodecProduceOriginals(decoder, N, blockBytes, finalBytes, message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "!! Decoder2 failed to produce originals" << endl;
        return false;
    }

    return true;
}